

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::handle_builtin
          (ActiveBuiltinHandler *this,SPIRType *type,BuiltIn builtin,Bitset *decoration_flags)

{
  uint uVar1;
  CompilerError *pCVar2;
  allocator local_39;
  string local_38;
  
  if (builtin == BuiltInPosition) {
    if ((decoration_flags->lower & 0x40000) != 0) {
      this->compiler->position_invariant = true;
    }
  }
  else if (builtin == BuiltInCullDistance) {
    if (*(type->array_size_literal).super_VectorView<bool>.ptr == false) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Array size for CullDistance must be a literal.",&local_39);
      CompilerError::CompilerError(pCVar2,&local_38);
      __cxa_throw(pCVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = *(type->array).super_VectorView<unsigned_int>.ptr;
    if (uVar1 == 0) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Array size for CullDistance must not be unsized.",&local_39);
      CompilerError::CompilerError(pCVar2,&local_38);
      __cxa_throw(pCVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->compiler->cull_distance_count = uVar1;
  }
  else if (builtin == BuiltInClipDistance) {
    if (*(type->array_size_literal).super_VectorView<bool>.ptr == false) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Array size for ClipDistance must be a literal.",&local_39);
      CompilerError::CompilerError(pCVar2,&local_38);
      __cxa_throw(pCVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = *(type->array).super_VectorView<unsigned_int>.ptr;
    if (uVar1 == 0) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Array size for ClipDistance must not be unsized.",&local_39);
      CompilerError::CompilerError(pCVar2,&local_38);
      __cxa_throw(pCVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->compiler->clip_distance_count = uVar1;
  }
  return;
}

Assistant:

void Compiler::ActiveBuiltinHandler::handle_builtin(const SPIRType &type, BuiltIn builtin,
                                                    const Bitset &decoration_flags)
{
	// If used, we will need to explicitly declare a new array size for these builtins.

	if (builtin == BuiltInClipDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for ClipDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for ClipDistance must not be unsized.");
		compiler.clip_distance_count = array_size;
	}
	else if (builtin == BuiltInCullDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for CullDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for CullDistance must not be unsized.");
		compiler.cull_distance_count = array_size;
	}
	else if (builtin == BuiltInPosition)
	{
		if (decoration_flags.get(DecorationInvariant))
			compiler.position_invariant = true;
	}
}